

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O1

TExecutionResult
Refal2::COperationsExecuter::Run
          (CProgramPtr *program,CReceptaclePtr *receptacle,CUnitList *fieldOfView,
          CUnitNode **errorCall)

{
  CNodeType *pCVar1;
  COperationsExecuter executer;
  CReceptaclePtr local_f0;
  CProgramPtr local_e0;
  COperationsExecuter local_d0;
  
  local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (receptacle->super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (receptacle->super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
       ._M_pi;
  if (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  COperationsExecuter(&local_d0,&local_e0,&local_f0);
  if (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (&local_d0.fieldOfView != fieldOfView) {
    pCVar1 = (fieldOfView->super_CNodeList<Refal2::CUnit>).first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                (&fieldOfView->super_CNodeList<Refal2::CUnit>,pCVar1,
                 (fieldOfView->super_CNodeList<Refal2::CUnit>).last);
    }
    pCVar1 = local_d0.fieldOfView.super_CNodeList<Refal2::CUnit>.first;
    (fieldOfView->super_CNodeList<Refal2::CUnit>).first = (CNodeType *)0x0;
    (fieldOfView->super_CNodeList<Refal2::CUnit>).last = (CNodeType *)0x0;
    local_d0.fieldOfView.super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (fieldOfView->super_CNodeList<Refal2::CUnit>).first = pCVar1;
    pCVar1 = (fieldOfView->super_CNodeList<Refal2::CUnit>).last;
    (fieldOfView->super_CNodeList<Refal2::CUnit>).last =
         local_d0.fieldOfView.super_CNodeList<Refal2::CUnit>.last;
    local_d0.fieldOfView.super_CNodeList<Refal2::CUnit>.last = pCVar1;
  }
  *errorCall = (CUnitNode *)local_d0.initialLeftBracket.super_CUnit.field_1;
  ~COperationsExecuter(&local_d0);
  return local_d0.super_CExecutionContext._60_4_;
}

Assistant:

TExecutionResult COperationsExecuter::Run( CProgramPtr program,
	CReceptaclePtr receptacle, CUnitList& fieldOfView, CUnitNode*& errorCall )
{
	COperationsExecuter executer( program, receptacle );
	executer.fieldOfView.Move( fieldOfView );
	errorCall = executer.initialLeftBracket.PairedParen();
	return executer.executionResult;
}